

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O2

void rw::uninstV3d(int type,V3d *dst,uint8 *src,uint32 numVertices,uint32 stride)

{
  uint uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  
  auVar3 = _DAT_0012fe40;
  if (type == 8) {
    while (bVar5 = numVertices != 0, numVertices = numVertices - 1, bVar5) {
      dst->z = *(float32 *)(src + 8);
      uVar2 = *(undefined8 *)src;
      dst->x = (float32)(int)uVar2;
      dst->y = (float32)(int)((ulong)uVar2 >> 0x20);
      src = src + stride;
      dst = dst + 1;
    }
  }
  else if (type == 0xc) {
    while (bVar5 = numVertices != 0, numVertices = numVertices - 1, bVar5) {
      uVar1 = *(uint *)src;
      uVar4 = (uVar1 >> 0x16) - 0x400;
      if (-1 < (int)uVar1) {
        uVar4 = uVar1 >> 0x16;
      }
      auVar6._0_4_ = (float)(int)(-(uint)((uVar1 & 0x400) == 0x400) & 0xfffff800 | uVar1 & 0x7ff);
      auVar6._4_4_ = (float)(int)(-(uint)((uVar1 & 0x200000) == 0x200000) & 0xfffff800 |
                                 uVar1 >> 0xb & 0x7ff);
      auVar6._8_8_ = 0;
      auVar6 = divps(auVar6,auVar3);
      dst->x = (float32)(int)auVar6._0_8_;
      dst->y = (float32)(int)((ulong)auVar6._0_8_ >> 0x20);
      dst->z = (float32)((float)(int)uVar4 / 511.0);
      src = (uint8 *)((long)src + (ulong)stride);
      dst = dst + 1;
    }
  }
  return;
}

Assistant:

void
uninstV3d(int type, V3d *dst, uint8 *src, uint32 numVertices, uint32 stride)
{
	if(type == VERT_FLOAT3)
		for(uint32 i = 0; i < numVertices; i++){
			memcpy(dst, src, 12);
			src += stride;
			dst++;
		}
	else if(type == VERT_COMPNORM)
		for(uint32 i = 0; i < numVertices; i++){
			uint32 n = *(uint32*)src;
			int32 normal[3];
			normal[0] = n & 0x7FF;
			normal[1] = (n >> 11) & 0x7FF;
			normal[2] = (n >> 22) & 0x3FF;
			// sign extend
			if(normal[0] & 0x400) normal[0] |= ~0x7FF;
			if(normal[1] & 0x400) normal[1] |= ~0x7FF;
			if(normal[2] & 0x200) normal[2] |= ~0x3FF;
			dst->x = normal[0] / 1023.0f;
			dst->y = normal[1] / 1023.0f;
			dst->z = normal[2] / 511.0f;
			src += stride;
			dst++;
		}
	else
		assert(0 && "unsupported uninstV3d type");
}